

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

Extension * __thiscall
google::protobuf::internal::ExtensionSet::MaybeNewRepeatedExtension
          (ExtensionSet *this,FieldDescriptor *descriptor)

{
  byte bVar1;
  bool bVar2;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar3;
  int line;
  Extension *extension;
  Extension *local_30;
  Label local_24;
  LogMessageFatal local_20;
  
  bVar2 = MaybeNewExtension(this,descriptor->number_,descriptor,&local_30);
  if (bVar2) {
    bVar1 = descriptor->type_;
    local_30->type = bVar1;
    local_20.super_LogMessage.errno_saver_.saved_errno_ =
         *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar1 * 4);
    local_24 = 10;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                            ((CppType *)&local_20,&local_24,
                             "cpp_type(extension->type) == FieldDescriptor::CPPTYPE_MESSAGE");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_30->is_repeated = true;
      local_30->field_0xa = local_30->field_0xa | 1;
      aVar3 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::
              CreateArenaCompatible<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                        (this->arena_);
      local_30->field_0 = aVar3;
      return local_30;
    }
    line = 0xd8;
  }
  else {
    local_20.super_LogMessage.errno_saver_.saved_errno_ = (uint)local_30->is_repeated * 2 + 1;
    local_24 = LABEL_REPEATED;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
                            ((Label *)&local_20,&local_24,
                             "(*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL == FieldDescriptor::LABEL_REPEATED"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_20.super_LogMessage.errno_saver_.saved_errno_ =
           *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_30->type * 4);
      local_24 = 10;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                              ((CppType *)&local_20,&local_24,
                               "cpp_type((*extension).type) == FieldDescriptor::CPPTYPE_MESSAGE");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        return local_30;
      }
    }
    line = 0xde;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

ExtensionSet::Extension* ExtensionSet::MaybeNewRepeatedExtension(
    const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    ABSL_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->ptr.repeated_message_value =
        Arena::Create<RepeatedPtrField<MessageLite> >(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }
  return extension;
}